

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_state_listsearch_resp(connectdata *conn,int imapcode,imapstate instate)

{
  char *__s;
  CURLcode CVar1;
  size_t sVar2;
  
  if (imapcode == 1) {
    (conn->proto).imapc.state = IMAP_STOP;
    CVar1 = CURLE_OK;
  }
  else if (imapcode == 0x2a) {
    __s = (conn->data->state).buffer;
    sVar2 = strlen(__s);
    __s[sVar2] = '\n';
    CVar1 = Curl_client_write(conn,1,__s,sVar2 + 1);
    __s[sVar2] = '\0';
  }
  else {
    CVar1 = CURLE_QUOTE_ERROR;
  }
  return CVar1;
}

Assistant:

static CURLcode imap_state_listsearch_resp(struct connectdata *conn,
                                           int imapcode,
                                           imapstate instate)
{
  CURLcode result = CURLE_OK;
  char *line = conn->data->state.buffer;
  size_t len = strlen(line);

  (void)instate; /* No use for this yet */

  if(imapcode == '*') {
    /* Temporarily add the LF character back and send as body to the client */
    line[len] = '\n';
    result = Curl_client_write(conn, CLIENTWRITE_BODY, line, len + 1);
    line[len] = '\0';
  }
  else if(imapcode != IMAP_RESP_OK)
    result = CURLE_QUOTE_ERROR; /* TODO: Fix error code */
  else
    /* End of DO phase */
    state(conn, IMAP_STOP);

  return result;
}